

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser_.cxx
# Opt level: O3

void __thiscall Fl_Browser_::draw(Fl_Browser_ *this)

{
  uchar *puVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  uint X_00;
  byte bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  Fl_Color c;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *pvVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  Fl_Scrollbar *pFVar15;
  int H;
  int W;
  int Y;
  int X;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  ulong local_70;
  int local_64;
  int local_60;
  uint local_5c;
  ulong local_58;
  uint local_50;
  int local_4c;
  void **local_48;
  Fl_Browser_ *local_40;
  ulong local_38;
  undefined4 extraout_var_01;
  
  update_top(this);
  iVar7 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x15])(this);
  iVar8 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x16])(this);
  bbox(this,(int *)&local_74,(int *)&local_78,(int *)&local_7c,(int *)&local_80);
  local_48 = &this->redraw1;
  local_50 = (uint)CONCAT71((int7)((ulong)local_48 >> 8),1);
  bVar4 = false;
  local_40 = this;
  while( true ) {
    if ((char)(this->super_Fl_Group).super_Fl_Widget.damage_ < '\0') {
      bVar6 = (this->super_Fl_Group).super_Fl_Widget.box_;
      if (bVar6 == 0) {
        bVar6 = 3;
      }
      Fl_Widget::draw_box((Fl_Widget *)this,(uint)bVar6,(this->super_Fl_Group).super_Fl_Widget.x_,
                          (this->super_Fl_Group).super_Fl_Widget.y_,
                          (this->super_Fl_Group).super_Fl_Widget.w_,
                          (this->super_Fl_Group).super_Fl_Widget.h_,
                          (this->super_Fl_Group).super_Fl_Widget.color_);
      bVar4 = true;
    }
    if (((this->has_scrollbar_ & 2) == 0) ||
       ((((this->has_scrollbar_ & 4) == 0 && (this->position_ == 0)) && (iVar8 <= (int)local_80))))
    {
      iVar9 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[10])(this);
      this->top_ = (void *)CONCAT44(extraout_var,iVar9);
      this->offset_ = 0;
      this->real_position_ = 0;
      uVar10 = (this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_;
      if ((uVar10 & 2) == 0) {
        (this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ = uVar10 | 2;
        puVar1 = &(this->super_Fl_Group).super_Fl_Widget.damage_;
        *puVar1 = *puVar1 | 4;
      }
    }
    else {
      uVar10 = (this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_;
      if ((uVar10 & 2) != 0) {
        (this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ =
             uVar10 & 0xfffffffd;
        bbox(this,(int *)&local_74,(int *)&local_78,(int *)&local_7c,(int *)&local_80);
        bVar4 = true;
      }
    }
    bVar6 = this->has_scrollbar_;
    if (((bVar6 & 1) == 0) ||
       ((((bVar6 & 4) == 0 && (this->hposition_ == 0)) && (iVar7 <= (int)local_7c)))) {
      this->real_hposition_ = 0;
      uVar10 = (this->hscrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_;
      if ((uVar10 & 2) == 0) {
        (this->hscrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ = uVar10 | 2;
        puVar1 = &(this->super_Fl_Group).super_Fl_Widget.damage_;
        *puVar1 = *puVar1 | 4;
      }
    }
    else {
      uVar10 = (this->hscrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_;
      if ((uVar10 & 2) != 0) {
        (this->hscrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ =
             uVar10 & 0xfffffffd;
        bbox(this,(int *)&local_74,(int *)&local_78,(int *)&local_7c,(int *)&local_80);
        bVar6 = this->has_scrollbar_;
        bVar4 = true;
      }
    }
    local_64 = iVar8;
    local_60 = iVar7;
    if (((bVar6 & 2) == 0) ||
       ((((bVar6 & 4) == 0 && (this->position_ == 0)) && (iVar8 <= (int)local_80)))) {
      iVar8 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[10])(this);
      this->top_ = (void *)CONCAT44(extraout_var_00,iVar8);
      this->offset_ = 0;
      this->real_position_ = 0;
      uVar10 = (this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_;
      if ((uVar10 & 2) == 0) {
        (this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ = uVar10 | 2;
        puVar1 = &(this->super_Fl_Group).super_Fl_Widget.damage_;
        *puVar1 = *puVar1 | 4;
      }
    }
    else {
      uVar10 = (this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_;
      if ((uVar10 & 2) != 0) {
        (this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ =
             uVar10 & 0xfffffffd;
        bbox(this,(int *)&local_74,(int *)&local_78,(int *)&local_7c,(int *)&local_80);
        bVar4 = true;
      }
    }
    bbox(this,(int *)&local_74,(int *)&local_78,(int *)&local_7c,(int *)&local_80);
    X_00 = local_74;
    uVar5 = local_7c;
    uVar13 = local_80;
    local_58 = (ulong)local_78;
    uVar12 = (ulong)local_7c;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])();
    pvVar11 = this->top_;
    uVar10 = -this->offset_;
    uVar14 = (ulong)uVar10;
    bVar2 = SBORROW4(uVar13,uVar10) == (int)(uVar13 + this->offset_) < 0;
    bVar3 = uVar13 != uVar10 && bVar2;
    local_5c = uVar13;
    local_70 = uVar12;
    if (pvVar11 != (void *)0x0 && (uVar13 != uVar10 && bVar2)) {
      local_4c = uVar5 + 1;
      do {
        uVar10 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xe])(this,pvVar11);
        if (0 < (int)uVar10) {
          if (((((this->super_Fl_Group).super_Fl_Widget.damage_ & 0x84) != 0) ||
              (pvVar11 == this->redraw1)) || (pvVar11 == this->redraw2)) {
            iVar8 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x19])(this,pvVar11);
            if (iVar8 == 0) {
              uVar13 = (int)uVar14 + (int)local_58;
              if (-1 < (char)(this->super_Fl_Group).super_Fl_Widget.damage_) {
                (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
                          (fl_graphics_driver,(ulong)X_00,(ulong)uVar13,local_70,(ulong)uVar10);
                bVar6 = (this->super_Fl_Group).super_Fl_Widget.box_;
                if (bVar6 == 0) {
                  bVar6 = 3;
                }
                Fl_Widget::draw_box((Fl_Widget *)this,(uint)bVar6,
                                    (this->super_Fl_Group).super_Fl_Widget.x_,
                                    (this->super_Fl_Group).super_Fl_Widget.y_,
                                    (this->super_Fl_Group).super_Fl_Widget.w_,
                                    (this->super_Fl_Group).super_Fl_Widget.h_,
                                    (this->super_Fl_Group).super_Fl_Widget.color_);
                (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
                uVar12 = local_70;
              }
            }
            else {
              iVar8 = Fl_Widget::active_r((Fl_Widget *)this);
              c = (this->super_Fl_Group).super_Fl_Widget.color2_;
              if (iVar8 == 0) {
                c = fl_inactive(c);
              }
              (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                        (fl_graphics_driver,(ulong)c);
              uVar12 = local_70;
              uVar13 = (int)uVar14 + (int)local_58;
              (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                        (fl_graphics_driver,(ulong)X_00,(ulong)uVar13,local_70 & 0xffffffff,
                         (ulong)uVar10);
              this = local_40;
            }
            (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x11])
                      (this,pvVar11,(ulong)(X_00 - this->hposition_),(ulong)uVar13,
                       (ulong)(uint)(this->hposition_ + (int)uVar12),(ulong)uVar10);
            if ((pvVar11 == this->selection_) && ((Fl_Browser_ *)Fl::focus_ == this)) {
              local_38 = uVar14;
              Fl_Widget::draw_box((Fl_Widget *)this,FL_BORDER_FRAME,X_00,uVar13,(int)uVar12,uVar10,
                                  (this->super_Fl_Group).super_Fl_Widget.color_);
              uVar14 = local_38;
              Fl_Widget::draw_focus((Fl_Widget *)this,FL_NO_BOX,X_00,uVar13,local_4c,uVar10 + 1);
            }
            iVar8 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xf])(this,pvVar11);
            uVar13 = local_5c;
            if (this->max_width < iVar8) {
              this->max_width = iVar8;
              this->max_width_item = pvVar11;
            }
          }
          uVar14 = (ulong)((int)uVar14 + uVar10);
        }
        iVar8 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,pvVar11);
        pvVar11 = (void *)CONCAT44(extraout_var_01,iVar8);
        bVar3 = (int)uVar14 < (int)uVar13;
      } while ((pvVar11 != (void *)0x0) && ((int)uVar14 < (int)uVar13));
    }
    if ((-1 < (char)(this->super_Fl_Group).super_Fl_Widget.damage_) && (bVar3)) {
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
                (fl_graphics_driver,(ulong)X_00,(ulong)(uint)((int)uVar14 + (int)local_58),
                 uVar12 & 0xffffffff,(ulong)(uVar13 - (int)uVar14));
      bVar6 = (this->super_Fl_Group).super_Fl_Widget.box_;
      if (bVar6 == 0) {
        bVar6 = 3;
      }
      Fl_Widget::draw_box((Fl_Widget *)this,(uint)bVar6,(this->super_Fl_Group).super_Fl_Widget.x_,
                          (this->super_Fl_Group).super_Fl_Widget.y_,
                          (this->super_Fl_Group).super_Fl_Widget.w_,
                          (this->super_Fl_Group).super_Fl_Widget.h_,
                          (this->super_Fl_Group).super_Fl_Widget.color_);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
              (fl_graphics_driver,(ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.x_,
               (ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.y_,
               (ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.w_,
               (ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.h_);
    *local_48 = (void *)0x0;
    local_48[1] = (void *)0x0;
    iVar9 = (int)uVar12;
    iVar8 = local_64;
    iVar7 = local_60;
    if ((local_50 & 1) == 0) break;
    iVar8 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x16])(this);
    iVar7 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x15])(this);
    bVar6 = this->has_scrollbar_;
    if (((bVar6 & 2) == 0) ||
       (((iVar8 <= (int)uVar13 && ((bVar6 & 4) == 0)) && (this->position_ == 0)))) {
      if (((this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ & 2) != 0)
      goto LAB_001a7d7b;
    }
    else if (((this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ & 2) == 0)
    {
LAB_001a7d7b:
      iVar9 = (int)local_70;
      if (((bVar6 & 1) == 0) ||
         (((iVar7 <= (int)local_70 && ((bVar6 & 4) == 0)) && (this->hposition_ == 0)))) {
        if (((this->hscrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ & 2) != 0)
        break;
      }
      else if (((this->hscrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ & 2) ==
               0) break;
    }
    Fl_Widget::damage((Fl_Widget *)this,0x80);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
    local_50 = 0;
  }
  local_60 = iVar7;
  local_64 = iVar8;
  uVar10 = this->scrollbar_size_;
  if (uVar10 == 0) {
    uVar10 = Fl::scrollbar_size();
  }
  if (this->top_ == (void *)0x0) {
    iVar8 = 0;
  }
  else {
    iVar8 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x10])(this);
  }
  uVar13 = local_5c;
  iVar7 = 10;
  if (10 < iVar8) {
    iVar7 = iVar8;
  }
  if (((this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ & 2) == 0) {
    pFVar15 = &this->scrollbar;
    iVar8 = -uVar10;
    if (((this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.label_.align_ & 4) == 0
       ) {
      iVar8 = iVar9;
    }
    Fl_Widget::damage_resize((Fl_Widget *)pFVar15,iVar8 + X_00,(int)local_58,uVar10,local_5c);
    Fl_Slider::scrollvalue(&pFVar15->super_Fl_Slider,this->position_,uVar13,0,local_64);
    *(int *)&(this->scrollbar).super_Fl_Slider.field_0xac = iVar7;
    if (bVar4) {
      Fl_Group::draw_child(&this->super_Fl_Group,(Fl_Widget *)pFVar15);
      iVar9 = (int)local_70;
      goto LAB_001a7e96;
    }
    Fl_Group::update_child(&this->super_Fl_Group,(Fl_Widget *)pFVar15);
    if (((this->hscrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ & 2) != 0)
    goto LAB_001a7f88;
    iVar9 = (int)local_70;
LAB_001a7eac:
    pFVar15 = &this->hscrollbar;
    uVar13 = -uVar10;
    if (((this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.label_.align_ & 1) == 0
       ) {
      uVar13 = local_5c;
    }
    Fl_Widget::damage_resize((Fl_Widget *)pFVar15,X_00,uVar13 + (int)local_58,iVar9,uVar10);
    Fl_Slider::scrollvalue(&pFVar15->super_Fl_Slider,this->hposition_,iVar9,0,local_60);
    *(int *)&(this->hscrollbar).super_Fl_Slider.field_0xac = iVar7;
    if (!bVar4) {
      Fl_Group::update_child(&this->super_Fl_Group,(Fl_Widget *)pFVar15);
      goto LAB_001a7f88;
    }
    Fl_Group::draw_child(&this->super_Fl_Group,(Fl_Widget *)pFVar15);
  }
  else {
LAB_001a7e96:
    if (((this->hscrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ & 2) == 0)
    goto LAB_001a7eac;
    if (!bVar4) goto LAB_001a7f88;
  }
  if ((((this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ & 2) == 0) &&
     (((this->hscrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ & 2) == 0)) {
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
              (fl_graphics_driver,
               (ulong)(((this->super_Fl_Group).super_Fl_Widget.parent_)->super_Fl_Widget).color_);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
              (fl_graphics_driver,
               (ulong)(uint)(this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.x_,
               (ulong)(uint)(this->hscrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.y_,
               (ulong)uVar10,(ulong)uVar10);
  }
LAB_001a7f88:
  this->real_hposition_ = this->hposition_;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
  return;
}

Assistant:

void Fl_Browser_::draw() {
  int drawsquare = 0;
  update_top();
  int full_width_ = full_width();
  int full_height_ = full_height();
  int X, Y, W, H; bbox(X, Y, W, H);
  int dont_repeat = 0;
J1:
  if (damage() & FL_DAMAGE_ALL) { // redraw the box if full redraw
    Fl_Boxtype b = box() ? box() : FL_DOWN_BOX;
    draw_box(b, x(), y(), w(), h(), color());
    drawsquare = 1;
  }
  // see if scrollbar needs to be switched on/off:
  if ((has_scrollbar_ & VERTICAL) && (
	(has_scrollbar_ & ALWAYS_ON) || position_ || full_height_ > H)) {
    if (!scrollbar.visible()) {
      scrollbar.set_visible();
      drawsquare = 1;
      bbox(X, Y, W, H);
    }
  } else {
    top_ = item_first(); real_position_ = offset_ = 0;
    if (scrollbar.visible()) {
      scrollbar.clear_visible();
      clear_damage((uchar)(damage()|FL_DAMAGE_SCROLL));
    }
  }

  if ((has_scrollbar_ & HORIZONTAL) && (
	(has_scrollbar_ & ALWAYS_ON) || hposition_ || full_width_ > W)) {
    if (!hscrollbar.visible()) {
      hscrollbar.set_visible();
      drawsquare = 1;
      bbox(X, Y, W, H);
    }
  } else {
    real_hposition_ = 0;
    if (hscrollbar.visible()) {
      hscrollbar.clear_visible();
      clear_damage((uchar)(damage()|FL_DAMAGE_SCROLL));
    }
  }

  // Check the vertical scrollbar again, just in case it needs to be drawn
  // because the horizontal one is drawn.  There should be a cleaner way
  // to do this besides copying the same code...
  if ((has_scrollbar_ & VERTICAL) && (
	(has_scrollbar_ & ALWAYS_ON) || position_ || full_height_ > H)) {
    if (!scrollbar.visible()) {
      scrollbar.set_visible();
      drawsquare = 1;
      bbox(X, Y, W, H);
    }
  } else {
    top_ = item_first(); real_position_ = offset_ = 0;
    if (scrollbar.visible()) {
      scrollbar.clear_visible();
      clear_damage((uchar)(damage()|FL_DAMAGE_SCROLL));
    }
  }

  bbox(X, Y, W, H);

  fl_push_clip(X, Y, W, H);
  // for each line, draw it if full redraw or scrolled.  Erase background
  // if not a full redraw or if it is selected:
  void* l = top();
  int yy = -offset_;
  for (; l && yy < H; l = item_next(l)) {
    int hh = item_height(l);
    if (hh <= 0) continue;
    if ((damage()&(FL_DAMAGE_SCROLL|FL_DAMAGE_ALL)) || l == redraw1 || l == redraw2) {
      if (item_selected(l)) {
	fl_color(active_r() ? selection_color() : fl_inactive(selection_color()));
	fl_rectf(X, yy+Y, W, hh);
      } else if (!(damage()&FL_DAMAGE_ALL)) {
	fl_push_clip(X, yy+Y, W, hh);
	draw_box(box() ? box() : FL_DOWN_BOX, x(), y(), w(), h(), color());
	fl_pop_clip();
      }
      item_draw(l, X-hposition_, yy+Y, W+hposition_, hh);
      if (l == selection_ && Fl::focus() == this) {
	draw_box(FL_BORDER_FRAME, X, yy+Y, W, hh, color());
	draw_focus(FL_NO_BOX, X, yy+Y, W+1, hh+1);
      }
      int ww = item_width(l);
      if (ww > max_width) {max_width = ww; max_width_item = l;}
    }
    yy += hh;
  }
  // erase the area below last line:
  if (!(damage()&FL_DAMAGE_ALL) && yy < H) {
    fl_push_clip(X, yy+Y, W, H-yy);
    draw_box(box() ? box() : FL_DOWN_BOX, x(), y(), w(), h(), color());
    fl_pop_clip();
  }
  fl_pop_clip();

  fl_push_clip(x(),y(),w(),h());		// STR# 2886
  redraw1 = redraw2 = 0;
  if (!dont_repeat) {
    dont_repeat = 1;
    // see if changes to full_height caused by calls to slow_height
    // caused scrollbar state to change, in which case we have to redraw:
    full_height_ = full_height();
    full_width_ = full_width();
    if ((has_scrollbar_ & VERTICAL) &&
	((has_scrollbar_ & ALWAYS_ON) || position_ || full_height_>H)) {
      if (!scrollbar.visible()) { damage(FL_DAMAGE_ALL); fl_pop_clip(); goto J1; }
    } else {
      if (scrollbar.visible()) { damage(FL_DAMAGE_ALL); fl_pop_clip(); goto J1; }
    }
    if ((has_scrollbar_ & HORIZONTAL) &&
	((has_scrollbar_ & ALWAYS_ON) || hposition_ || full_width_>W)) {
      if (!hscrollbar.visible()) { damage(FL_DAMAGE_ALL); fl_pop_clip(); goto J1; }
    } else {
      if (hscrollbar.visible()) { damage(FL_DAMAGE_ALL); fl_pop_clip(); goto J1; }
    }
  }

  // update the scrollbars and redraw them:
  int scrollsize = scrollbar_size_ ? scrollbar_size_ : Fl::scrollbar_size();
  int dy = top_ ? item_quick_height(top_) : 0; if (dy < 10) dy = 10;
  if (scrollbar.visible()) {
    scrollbar.damage_resize(
	scrollbar.align()&FL_ALIGN_LEFT ? X-scrollsize : X+W,
	Y, scrollsize, H);
    scrollbar.value(position_, H, 0, full_height_);
    scrollbar.linesize(dy);
    if (drawsquare) draw_child(scrollbar);
    else update_child(scrollbar);
  }
  if (hscrollbar.visible()) {
    hscrollbar.damage_resize(
	X, scrollbar.align()&FL_ALIGN_TOP ? Y-scrollsize : Y+H,
	W, scrollsize);
    hscrollbar.value(hposition_, W, 0, full_width_);
    hscrollbar.linesize(dy);
    if (drawsquare) draw_child(hscrollbar);
    else update_child(hscrollbar);
  }

  // draw that little square between the scrollbars:
  if (drawsquare && scrollbar.visible() && hscrollbar.visible()) {
    fl_color(parent()->color());
    fl_rectf(scrollbar.x(), hscrollbar.y(), scrollsize, scrollsize);
  }

  real_hposition_ = hposition_;
  fl_pop_clip();
}